

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O1

double estimate<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,void(*)(std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&,unsigned_long)>
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *v,
                 set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *t,
                 _func_void_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_ptr_unsigned_long
                 *f)

{
  unsigned_long *puVar1;
  long lVar2;
  long lVar3;
  unsigned_long *puVar4;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  puVar1 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    (*f)(t,*puVar4);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  return (double)(lVar3 - lVar2) / 1000000000.0;
}

Assistant:

double estimate(std::vector<std::uint64_t> &v, Tree &t, Functor f) {
  auto start = std::chrono::system_clock::now();
  for (auto i : v)
    f(t, i);
  auto end = std::chrono::system_clock::now();

  return std::chrono::duration<double>(end - start).count();
}